

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotatedPagesPDF.cpp
# Opt level: O3

int RotatedPagesPDF(int argc,char **argv)

{
  _List_node_base *p_Var1;
  PDFDictionary *pPVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  PDFDictionary *pPVar7;
  byte bVar8;
  PDFDictionary *pPVar9;
  EStatusCode EVar10;
  EStatusCode EVar11;
  EncryptionOptions *pEVar12;
  BoolAndInt *pBVar13;
  ostream *poVar14;
  PageContentContext *inPageContext;
  LogConfiguration *inLogConfiguration;
  PDFParsingOptions *pPVar15;
  IByteReaderWithPosition *inSourceStream;
  unsigned_long uVar16;
  long lVar17;
  int iVar18;
  ulong inPageIndex;
  char *pcVar19;
  uint uVar20;
  bool bVar21;
  EStatusCodeAndObjectIDTypeList result;
  PDFPageInput input;
  RefCountPtr<PDFDictionary> page_1;
  TextOptions textOptions;
  LogConfiguration logConfiguration;
  InputFile pdfFile;
  PDFParser pdfParser;
  PDFWriter pdfWriter;
  undefined1 local_1820 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1810;
  string local_1800;
  char **local_17e0;
  undefined1 local_17d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17c8;
  undefined1 local_17b8 [32];
  double local_1798;
  _List_node_base local_1790;
  undefined8 local_1780;
  undefined1 local_1778 [8];
  _Alloc_hider local_1770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1760;
  longlong local_1750;
  _Alloc_hider local_1748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1738;
  undefined1 local_1728 [8];
  _Alloc_hider local_1720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1710;
  longlong local_1700;
  _Alloc_hider local_16f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16e8;
  LogConfiguration local_16d8;
  InputFile local_16a8 [2];
  ios_base local_1638 [264];
  undefined1 local_1530 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1510;
  _Alloc_hider local_14f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14e8 [96];
  undefined1 local_ee0 [3760];
  
  local_1530._0_8_ = &local_1520;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1530,"RotatedPagesLog.txt","");
  local_17e0 = argv;
  BuildRelativeOutputPath((string *)local_ee0,(char **)argv[2],(string *)local_1530);
  LogConfiguration::LogConfiguration(&local_16d8,true,true,(string *)local_ee0);
  if ((undefined1 *)local_ee0._0_8_ != local_ee0 + 0x10) {
    operator_delete((void *)local_ee0._0_8_,local_ee0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1530._0_8_ != &local_1520) {
    operator_delete((void *)local_1530._0_8_,local_1520._M_allocated_capacity + 1);
  }
  PDFWriter::PDFWriter((PDFWriter *)local_ee0);
  local_17b8._0_8_ = local_17b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17b8,"RotatedPages.pdf","");
  BuildRelativeOutputPath(&local_16a8[0].mFilePath,(char **)local_17e0[2],(string *)local_17b8);
  pEVar12 = EncryptionOptions::DefaultEncryptionOptions();
  local_1728[0] = pEVar12->ShouldEncrypt;
  pcVar4 = (pEVar12->UserPassword)._M_dataplus._M_p;
  local_1720._M_p = (pointer)&local_1710;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1720,pcVar4,pcVar4 + (pEVar12->UserPassword)._M_string_length);
  local_1700 = pEVar12->UserProtectionOptionsFlag;
  pcVar4 = (pEVar12->OwnerPassword)._M_dataplus._M_p;
  local_16f8._M_p = (pointer)&local_16e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_16f8,pcVar4,pcVar4 + (pEVar12->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_1530,true,true,(EncryptionOptions *)local_1728,false);
  EVar10 = PDFWriter::StartPDF((PDFWriter *)local_ee0,&local_16a8[0].mFilePath,ePDFVersion13,
                               &local_16d8,(PDFCreationSettings *)local_1530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f8._M_p != local_14e8) {
    operator_delete(local_14f8._M_p,local_14e8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1520._M_allocated_capacity != &local_1510) {
    operator_delete((void *)local_1520._M_allocated_capacity,local_1510._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8._M_p != &local_16e8) {
    operator_delete(local_16f8._M_p,local_16e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1720._M_p != &local_1710) {
    operator_delete(local_1720._M_p,local_1710._M_allocated_capacity + 1);
  }
  paVar3 = &local_16a8[0].mFilePath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a8[0].mFilePath._M_dataplus._M_p != paVar3) {
    operator_delete(local_16a8[0].mFilePath._M_dataplus._M_p,
                    local_16a8[0].mFilePath.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_17b8._0_8_ != local_17b8 + 0x10) {
    operator_delete((void *)local_17b8._0_8_,local_17b8._16_8_ + 1);
  }
  if (EVar10 == eSuccess) {
    local_1800._M_dataplus._M_p = (pointer)&local_1800.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1800,"fonts/arial.ttf","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_16a8,local_17e0[1],(allocator<char> *)local_17d8);
    LocalPathToFileURL((FileURL *)local_1530,&local_16a8[0].mFilePath);
    RelativeURLToLocalPath((string *)local_1820,(FileURL *)local_1530,&local_1800);
    FileURL::~FileURL((FileURL *)local_1530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16a8[0].mFilePath._M_dataplus._M_p != paVar3) {
      operator_delete(local_16a8[0].mFilePath._M_dataplus._M_p,
                      local_16a8[0].mFilePath.field_2._M_allocated_capacity + 1);
    }
    local_17b8._24_8_ = PDFWriter::GetFontForFile((PDFWriter *)local_ee0,(string *)local_1820,0);
    local_17b8._16_8_ = 0x402c000000000000;
    local_17b8._0_4_ = 2;
    local_17b8._8_8_ = 0;
    local_1798 = 255.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1820._0_8_ != &local_1810) {
      operator_delete((void *)local_1820._0_8_,(ulong)(local_1810._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1800._M_dataplus._M_p != &local_1800.field_2) {
      operator_delete(local_1800._M_dataplus._M_p,local_1800.field_2._M_allocated_capacity + 1);
    }
    iVar18 = 0;
    uVar20 = 0;
    do {
      PDFPage::PDFPage((PDFPage *)local_1530);
      PDFRectangle::PDFRectangle((PDFRectangle *)local_16a8,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox((PDFPage *)local_1530,(PDFRectangle *)local_16a8);
      PDFRectangle::~PDFRectangle((PDFRectangle *)local_16a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Setting invalid rotation to 33\n",0x1f);
      PDFPage::SetRotate((PDFPage *)local_1530,0x21);
      pBVar13 = PDFPage::GetRotate((PDFPage *)local_1530);
      if (pBVar13->second != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Failed to reject invalid rotation\n",0x22);
        PDFPage::~PDFPage((PDFPage *)local_1530);
        break;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"success in failing to apply invalid rotation\n",0x2d);
      PDFPage::SetRotate((PDFPage *)local_1530,iVar18);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_16a8,"Page rotated by ",0x10);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_16a8,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," degrees.",9);
      inPageContext =
           PDFWriter::StartPageContentContext((PDFWriter *)local_ee0,(PDFPage *)local_1530);
      std::__cxx11::stringbuf::str();
      AbstractContentContext::WriteText
                (&inPageContext->super_AbstractContentContext,75.0,805.0,(string *)local_1820,
                 (TextOptions *)local_17b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1820._0_8_ != &local_1810) {
        operator_delete((void *)local_1820._0_8_,(ulong)(local_1810._M_allocated_capacity + 1));
      }
      EVar10 = PDFWriter::EndPageContentContext((PDFWriter *)local_ee0,inPageContext);
      lVar17 = 0x1e;
      poVar14 = (ostream *)&std::cout;
      pcVar19 = "Failed to end content context\n";
      if (EVar10 == eSuccess) {
        EVar11 = PDFWriter::WritePage((PDFWriter *)local_ee0,(PDFPage *)local_1530);
        if (EVar11 != eSuccess) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"failed to write page ",0x15);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar20);
          lVar17 = 1;
          pcVar19 = "\n";
          goto LAB_00150111;
        }
        bVar8 = 1;
      }
      else {
LAB_00150111:
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar19,lVar17);
        bVar8 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a8);
      std::ios_base::~ios_base(local_1638);
      PDFPage::~PDFPage((PDFPage *)local_1530);
      if (EVar10 != eSuccess) break;
      bVar21 = uVar20 < 5;
      uVar20 = uVar20 + 1;
      iVar18 = iVar18 + 0x5a;
    } while ((bool)(bVar8 & bVar21));
    EVar10 = PDFWriter::EndPDF((PDFWriter *)local_ee0);
    if (EVar10 == eSuccess) {
      local_1820._0_8_ = &local_1810;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1820,"RotatedPagesCopy.pdf","");
      BuildRelativeOutputPath(&local_16a8[0].mFilePath,(char **)local_17e0[2],(string *)local_1820);
      inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
      pEVar12 = EncryptionOptions::DefaultEncryptionOptions();
      local_1778[0] = pEVar12->ShouldEncrypt;
      pcVar4 = (pEVar12->UserPassword)._M_dataplus._M_p;
      local_1770._M_p = (pointer)&local_1760;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1770,pcVar4,pcVar4 + (pEVar12->UserPassword)._M_string_length);
      local_1750 = pEVar12->UserProtectionOptionsFlag;
      pcVar4 = (pEVar12->OwnerPassword)._M_dataplus._M_p;
      local_1748._M_p = (pointer)&local_1738;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1748,pcVar4,pcVar4 + (pEVar12->OwnerPassword)._M_string_length);
      PDFCreationSettings::PDFCreationSettings
                ((PDFCreationSettings *)local_1530,true,true,(EncryptionOptions *)local_1778,false);
      EVar10 = PDFWriter::StartPDF((PDFWriter *)local_ee0,&local_16a8[0].mFilePath,ePDFVersion13,
                                   inLogConfiguration,(PDFCreationSettings *)local_1530);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14f8._M_p != local_14e8) {
        operator_delete(local_14f8._M_p,local_14e8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1520._M_allocated_capacity != &local_1510) {
        operator_delete((void *)local_1520._M_allocated_capacity,
                        local_1510._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1748._M_p != &local_1738) {
        operator_delete(local_1748._M_p,local_1738._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1770._M_p != &local_1760) {
        operator_delete(local_1770._M_p,local_1760._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16a8[0].mFilePath._M_dataplus._M_p != &local_16a8[0].mFilePath.field_2) {
        operator_delete(local_16a8[0].mFilePath._M_dataplus._M_p,
                        local_16a8[0].mFilePath.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1820._0_8_ != &local_1810) {
        operator_delete((void *)local_1820._0_8_,(ulong)(local_1810._M_allocated_capacity + 1));
      }
      if (EVar10 == eSuccess) {
        p_Var1 = (_List_node_base *)(local_1820 + 8);
        local_1820._0_8_ = local_1820._0_8_ & 0xffffffff00000000;
        local_1810._8_8_ = 0;
        local_1800._M_dataplus._M_p = (pointer)&local_1800.field_2;
        local_1820._8_8_ = p_Var1;
        local_1810._M_allocated_capacity = (size_type)p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1800,"RotatedPages.pdf","")
        ;
        BuildRelativeOutputPath(&local_16a8[0].mFilePath,(char **)local_17e0[2],&local_1800);
        pPVar2 = (PDFDictionary *)(local_17d8 + 8);
        local_17c8._8_8_ = 0;
        local_17d8._0_8_ = (ulong)(uint)local_17d8._4_4_ << 0x20;
        local_1790._M_next = &local_1790;
        local_1780 = 0;
        local_17d8._8_8_ = pPVar2;
        local_17c8._M_allocated_capacity = (size_type)pPVar2;
        local_1790._M_prev = local_1790._M_next;
        pPVar15 = PDFParsingOptions::DefaultPDFParsingOptions();
        PDFWriter::AppendPDFPagesFromPDF
                  ((EStatusCodeAndObjectIDTypeList *)local_1530,(PDFWriter *)local_ee0,
                   &local_16a8[0].mFilePath,(PDFPageRange *)local_17d8,
                   (ObjectIDTypeList *)&local_1790,pPVar15);
        local_1820._0_4_ = local_1530._0_4_;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var1,
                   (_List_node_base *)(local_1530 + 8));
        while (p_Var5 = local_1790._M_next,
              (_List_node_base *)local_1530._8_8_ != (_List_node_base *)(local_1530 + 8)) {
          p_Var5 = ((_List_node_base *)local_1530._8_8_)->_M_next;
          operator_delete((void *)local_1530._8_8_,0x18);
          local_1530._8_8_ = p_Var5;
        }
        while (pPVar9 = (PDFDictionary *)local_17d8._8_8_, p_Var5 != &local_1790) {
          p_Var6 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var5->_M_next)
                   ->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var5,0x18);
          p_Var5 = p_Var6;
        }
        while (pPVar9 != pPVar2) {
          pPVar7 = (PDFDictionary *)
                   (pPVar9->super_PDFObject).super_RefCountObject._vptr_RefCountObject;
          operator_delete(pPVar9,0x20);
          pPVar9 = pPVar7;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_16a8[0].mFilePath._M_dataplus._M_p != &local_16a8[0].mFilePath.field_2) {
          operator_delete(local_16a8[0].mFilePath._M_dataplus._M_p,
                          local_16a8[0].mFilePath.field_2._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1800._M_dataplus._M_p != &local_1800.field_2) {
          operator_delete(local_1800._M_dataplus._M_p,local_1800.field_2._M_allocated_capacity + 1);
        }
        if (local_1820._0_4_ == 0) {
          EVar10 = PDFWriter::EndPDF((PDFWriter *)local_ee0);
          if (EVar10 == eSuccess) {
            InputFile::InputFile(local_16a8);
            PDFParser::PDFParser((PDFParser *)local_1530);
            local_17d8._0_8_ = &local_17c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_17d8,"RotatedPagesCopy.pdf","");
            BuildRelativeOutputPath(&local_1800,(char **)local_17e0[2],(string *)local_17d8);
            EVar10 = InputFile::OpenFile(local_16a8,&local_1800);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1800._M_dataplus._M_p != &local_1800.field_2) {
              operator_delete(local_1800._M_dataplus._M_p,
                              local_1800.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_17d8._0_8_ != &local_17c8) {
              operator_delete((void *)local_17d8._0_8_,(ulong)(local_17c8._M_allocated_capacity + 1)
                             );
            }
            if (EVar10 == eSuccess) {
              inSourceStream = InputFile::GetInputStream(local_16a8);
              pPVar15 = PDFParsingOptions::DefaultPDFParsingOptions();
              EVar10 = PDFParser::StartPDFParsing((PDFParser *)local_1530,inSourceStream,pPVar15);
              if (EVar10 == eSuccess) {
                uVar16 = PDFParser::GetPagesCount((PDFParser *)local_1530);
                if (uVar16 == 6) {
                  lVar17 = 0;
                  EVar10 = eSuccess;
                  inPageIndex = 0;
                  while( true ) {
                    uVar16 = PDFParser::GetPagesCount((PDFParser *)local_1530);
                    if ((EVar10 != eSuccess) || (uVar16 <= inPageIndex)) goto LAB_001507fe;
                    local_17d8._8_8_ = PDFParser::ParsePage((PDFParser *)local_1530,inPageIndex);
                    local_17d8._0_8_ = &PTR__RefCountPtr_003a5810;
                    if ((PDFDictionary *)local_17d8._8_8_ == (PDFDictionary *)0x0) break;
                    PDFPageInput::PDFPageInput
                              ((PDFPageInput *)&local_1800,(PDFParser *)local_1530,
                               (RefCountPtr<PDFDictionary> *)local_17d8);
                    iVar18 = PDFPageInput::GetRotate((PDFPageInput *)&local_1800);
                    EVar10 = eSuccess;
                    if (lVar17 != iVar18) {
                      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      EVar10 = eFailure;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,". page has invalid rotation\n",0x1c);
                    }
                    PDFPageInput::~PDFPageInput((PDFPageInput *)&local_1800);
                    RefCountPtr<PDFDictionary>::~RefCountPtr
                              ((RefCountPtr<PDFDictionary> *)local_17d8);
                    if (lVar17 != iVar18) goto LAB_001507fe;
                    inPageIndex = inPageIndex + 1;
                    lVar17 = lVar17 + 0x5a;
                  }
                  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,". page parsing failed\n",0x16);
                  RefCountPtr<PDFDictionary>::~RefCountPtr((RefCountPtr<PDFDictionary> *)local_17d8)
                  ;
                  EVar10 = eFailure;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"expecting 6 pages, got ",0x17);
                  PDFParser::GetPagesCount((PDFParser *)local_1530);
                  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  EVar10 = eFailure;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"unable to parse input file",0x1a);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "unable to open file RotatedPagesCopy.pdf for reading.\n",0x36);
            }
LAB_001507fe:
            PDFParser::~PDFParser((PDFParser *)local_1530);
            InputFile::~InputFile(local_16a8);
            p_Var5 = (_List_node_base *)local_1820._8_8_;
          }
          else {
            EVar10 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed in end RotatedPagesCopy.pdf\n",0x23);
            p_Var5 = (_List_node_base *)local_1820._8_8_;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"failed to append pages from RotatedPages.pdf\n",0x2d);
          p_Var5 = (_List_node_base *)local_1820._8_8_;
          EVar10 = local_1820._0_4_;
        }
        while (p_Var5 != p_Var1) {
          p_Var6 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var5->_M_next)
                   ->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var5,0x18);
          p_Var5 = p_Var6;
        }
        uVar20 = (uint)(EVar10 != eSuccess);
        goto LAB_0015037c;
      }
      lVar17 = 0x25;
      pcVar19 = "failed to start RotatedPagesCopy.pdf\n";
    }
    else {
      lVar17 = 0x1f;
      pcVar19 = "failed in end RotatedPages.pdf\n";
    }
    uVar20 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar17);
  }
  else {
    uVar20 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start RotatedPages.pdf\n",0x21);
  }
LAB_0015037c:
  PDFWriter::~PDFWriter((PDFWriter *)local_ee0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8.LogFileLocation._M_dataplus._M_p != &local_16d8.LogFileLocation.field_2) {
    operator_delete(local_16d8.LogFileLocation._M_dataplus._M_p,
                    local_16d8.LogFileLocation.field_2._M_allocated_capacity + 1);
  }
  return uVar20;
}

Assistant:

int RotatedPagesPDF(int argc, char* argv[])
{
	LogConfiguration logConfiguration(true,true,BuildRelativeOutputPath(argv,"RotatedPagesLog.txt"));
	EStatusCode status; 

	do
	{
		// PDF Page rotation writing

		PDFWriter pdfWriter;
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"RotatedPages.pdf"),
			ePDFVersion13,logConfiguration);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start RotatedPages.pdf\n";
			break;
		}	

		AbstractContentContext::TextOptions textOptions(pdfWriter.GetFontForFile(
																			BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf")),
																			14,
																			AbstractContentContext::eGray,
																			0);

		for(int i=0;i<6 && PDFHummus::eSuccess == status;++i)
		{
			PDFPage page;
			page.SetMediaBox(PDFRectangle(0,0,595,842));

			cout << "Setting invalid rotation to 33\n";
			page.SetRotate(33);
			if ( page.GetRotate().second != 0 )
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to reject invalid rotation\n";
				break;
			}
			cout << "success in failing to apply invalid rotation\n";

			page.SetRotate(i*90);
		
			std::ostringstream s;
			s << "Page rotated by " << i*90 << " degrees.";

			PageContentContext* cxt = pdfWriter.StartPageContentContext(&page);
			cxt->WriteText(75,805,s.str(),textOptions);
			status = pdfWriter.EndPageContentContext(cxt);
			if(status != eSuccess)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to end content context\n";
				break;
			}

			status = pdfWriter.WritePage(&page);
			if(status != PDFHummus::eSuccess)
				cout<<"failed to write page "<<i<<"\n";
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end RotatedPages.pdf\n";
			break;
		}


		// PDF page rotation copy
        
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"RotatedPagesCopy.pdf"),
			ePDFVersion13);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start RotatedPagesCopy.pdf\n";
			break;
		}
        
		EStatusCodeAndObjectIDTypeList result;
        
        // append pages
		result = pdfWriter.AppendPDFPagesFromPDF(
			BuildRelativeOutputPath(argv,"RotatedPages.pdf"),
			PDFPageRange());

		if(result.first != PDFHummus::eSuccess)
		{
			cout<<"failed to append pages from RotatedPages.pdf\n";
			status = result.first;
			break;
		}
        
		status = pdfWriter.EndPDF();

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end RotatedPagesCopy.pdf\n";
			break;
		}

		// PDF Page rotation parsing

		InputFile pdfFile;
		PDFParser pdfParser;

		status = pdfFile.OpenFile(
			BuildRelativeOutputPath(argv,"RotatedPagesCopy.pdf"));

		if(status != PDFHummus::eSuccess)
		{
			cout<<"unable to open file RotatedPagesCopy.pdf for reading.\n";
			break;
		}

		status = pdfParser.StartPDFParsing(pdfFile.GetInputStream());
		if(status != PDFHummus::eSuccess)
		{
			cout<<"unable to parse input file";
			break;
		}

		if(pdfParser.GetPagesCount() != 6)
		{
			cout<<"expecting 6 pages, got "<<pdfParser.GetPagesCount()<<"\n";
			status = PDFHummus::eFailure;
			break;
		}

		for(unsigned long i=0;i<pdfParser.GetPagesCount() && PDFHummus::eSuccess == status;++i)
		{
			RefCountPtr<PDFDictionary> page = pdfParser.ParsePage(i);
			if (!page)
			{
				cout << i << ". page parsing failed\n";
				status = PDFHummus::eFailure;
				break;
			}

			PDFPageInput input( &pdfParser, page );
			if ( input.GetRotate() != i*90 )
			{
				cout<< i << ". page has invalid rotation\n";
				status = PDFHummus::eFailure;
				break;
			}
		}

	}while(false);
	return status == eSuccess ? 0:1;
}